

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double_free.c
# Opt level: O2

int main(void)

{
  return 0;
}

Assistant:

int main() {
  char* buffer = (char*)malloc (256);
  bool error = true;

  if (error)
    free(buffer);

  // [...]

  free(buffer); // second free
}